

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3_commit_hook(sqlite3 *db,_func_int_void_ptr *xCallback,void *pArg)

{
  void *pvVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  void *pOld;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14c514);
  pvVar1 = *(void **)(in_RDI + 0x110);
  *(undefined8 *)(in_RDI + 0x118) = in_RSI;
  *(undefined8 *)(in_RDI + 0x110) = in_RDX;
  sqlite3_mutex_leave((sqlite3_mutex *)0x14c555);
  return pvVar1;
}

Assistant:

SQLITE_API void *sqlite3_commit_hook(
  sqlite3 *db,              /* Attach the hook to this database */
  int (*xCallback)(void*),  /* Function to invoke on each commit */
  void *pArg                /* Argument to the function */
){
  void *pOld;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  sqlite3_mutex_enter(db->mutex);
  pOld = db->pCommitArg;
  db->xCommitCallback = xCallback;
  db->pCommitArg = pArg;
  sqlite3_mutex_leave(db->mutex);
  return pOld;
}